

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O0

void __thiscall
testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
          (HasNewFatalFailureHelper *this)

{
  TestPartResultReporterInterface *pTVar1;
  UnitTestImpl *this_00;
  TestPartResultReporterInterface *in_RDI;
  TestPartResultReporterInterface *in_stack_ffffffffffffffb8;
  
  TestPartResultReporterInterface::TestPartResultReporterInterface(in_RDI);
  in_RDI->_vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__HasNewFatalFailureHelper_00191e40;
  *(undefined1 *)&in_RDI[1]._vptr_TestPartResultReporterInterface = 0;
  GetUnitTestImpl();
  pTVar1 = UnitTestImpl::GetTestPartResultReporterForCurrentThread((UnitTestImpl *)0x1434ea);
  in_RDI[2]._vptr_TestPartResultReporterInterface = (_func_int **)pTVar1;
  this_00 = GetUnitTestImpl();
  UnitTestImpl::SetTestPartResultReporterForCurrentThread(this_00,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

HasNewFatalFailureHelper::HasNewFatalFailureHelper()
    : has_new_fatal_failure_(false),
      original_reporter_(GetUnitTestImpl()->
                         GetTestPartResultReporterForCurrentThread()) {
  GetUnitTestImpl()->SetTestPartResultReporterForCurrentThread(this);
}